

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  int iVar2;
  int iVar3;
  ImGuiTable *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindowStackData *pIVar6;
  char *pcVar7;
  ImGuiContext *pIVar8;
  char *pcVar9;
  
  pIVar8 = GImGui;
  while( true ) {
    pIVar4 = pIVar8->CurrentTable;
    pIVar5 = pIVar8->CurrentWindow;
    if ((pIVar4 == (ImGuiTable *)0x0) ||
       ((pIVar4->OuterWindow != pIVar5 && (pIVar4->InnerWindow != pIVar5)))) break;
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                      pIVar4->OuterWindow->Name);
    }
    EndTable();
  }
  pIVar6 = (pIVar8->CurrentWindowStack).Data;
  iVar2 = (pIVar8->CurrentWindowStack).Size;
  while (pIVar8->CurrentTabBar != (ImGuiTabBar *)0x0) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar5->Name);
    }
    EndTabBar();
  }
  while (0 < (pIVar5->DC).TreeDepth) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar5->Name);
    }
    TreePop();
  }
  while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfGroupStack <
         (pIVar8->GroupStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar5->Name);
    }
    EndGroup();
  }
  while (1 < (pIVar5->IDStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar5->Name);
    }
    pIVar1 = &GImGui->CurrentWindow->IDStack;
    pIVar1->Size = pIVar1->Size + -1;
  }
  while (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfDisabledStack < pIVar8->DisabledStackSize)
  {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndDisabled() in \'%s\'",pIVar5->Name);
    }
    EndDisabled();
  }
  while (iVar3 = (pIVar8->ColorStack).Size,
        pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfColorStack < iVar3) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      pcVar7 = pIVar5->Name;
      pcVar9 = GetStyleColorName((pIVar8->ColorStack).Data[(long)iVar3 + -1].Col);
      (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                      pcVar7,pcVar9);
    }
    PopStyleColor(1);
  }
  while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfItemFlagsStack <
         (pIVar8->ItemFlagsStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopItemFlag() in \'%s\'",pIVar5->Name);
    }
    PopItemFlag();
  }
  while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
         (pIVar8->StyleVarStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar5->Name);
    }
    PopStyleVar(1);
  }
  while (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfFocusScopeStack + 1 <
         (pIVar8->FocusScopeStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar5->Name);
    }
    PopFocusScope();
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        EndDisabled();
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack + 1) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}